

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void __thiscall vkb::SwapchainBuilder::SwapchainBuilder(SwapchainBuilder *this,Device *device)

{
  bool bVar1;
  bool bVar2;
  uint *puVar3;
  undefined1 local_68 [8];
  Result<unsigned_int> graphics;
  undefined1 local_38 [8];
  Result<unsigned_int> present;
  Device *device_local;
  SwapchainBuilder *this_local;
  
  present._24_8_ = device;
  SwapchainInfo::SwapchainInfo(&this->info);
  (this->info).physical_device = *(VkPhysicalDevice *)(present._24_8_ + 0x28);
  (this->info).device = *(VkDevice *)present._24_8_;
  (this->info).surface = *(VkSurfaceKHR *)(present._24_8_ + 0x6c8);
  (this->info).instance_version = *(uint32_t *)(present._24_8_ + 0x6f8);
  Device::get_queue_index((Result<unsigned_int> *)local_38,(Device *)present._24_8_,present);
  Device::get_queue_index((Result<unsigned_int> *)local_68,(Device *)present._24_8_,graphics);
  bVar2 = Result<unsigned_int>::has_value((Result<unsigned_int> *)local_68);
  bVar1 = false;
  if (bVar2) {
    bVar2 = Result<unsigned_int>::has_value((Result<unsigned_int> *)local_38);
    bVar1 = false;
    if (bVar2) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    puVar3 = Result<unsigned_int>::value((Result<unsigned_int> *)local_38);
    (this->info).graphics_queue_index = *puVar3;
    puVar3 = Result<unsigned_int>::value((Result<unsigned_int> *)local_68);
    (this->info).present_queue_index = *puVar3;
    Result<unsigned_int>::~Result((Result<unsigned_int> *)local_68);
    Result<unsigned_int>::~Result((Result<unsigned_int> *)local_38);
    return;
  }
  __assert_fail("graphics.has_value() && present.has_value() && \"Graphics and Present queue indexes must be valid\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                ,0x74a,"vkb::SwapchainBuilder::SwapchainBuilder(const Device &)");
}

Assistant:

SwapchainBuilder::SwapchainBuilder(Device const& device) {
    info.physical_device = device.physical_device.physical_device;
    info.device = device.device;
    info.surface = device.surface;
    info.instance_version = device.instance_version;
    auto present = device.get_queue_index(QueueType::present);
    auto graphics = device.get_queue_index(QueueType::graphics);
    assert(graphics.has_value() && present.has_value() && "Graphics and Present queue indexes must be valid");
    info.graphics_queue_index = present.value();
    info.present_queue_index = graphics.value();
}